

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_extract_secret
              (secp256k1_context *ctx,uchar *adaptor_secret32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig65,secp256k1_pubkey_conflict *adaptor)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar sStack_1a8;
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  secp256k1_pubkey_conflict adaptor_expected;
  secp256k1_ge adaptor_expected_ge;
  secp256k1_gej adaptor_expected_gej;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_secret32 != NULL";
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig != NULL";
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_sig65 != NULL";
  }
  else {
    if (adaptor != (secp256k1_pubkey_conflict *)0x0) {
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,(secp256k1_scalar *)0x0,&local_188,adaptor_sig65);
      if (iVar1 == 0) {
        return 0;
      }
      local_168.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_168.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_168.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_168.d[3] = *(uint64_t *)(sig->data + 0x38);
      secp256k1_scalar_inverse(&sStack_1a8,&local_168);
      secp256k1_scalar_mul(&sStack_1a8,&sStack_1a8,&local_188);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&adaptor_expected_gej,&sStack_1a8);
      secp256k1_ge_set_gej(&adaptor_expected_ge,&adaptor_expected_gej);
      secp256k1_pubkey_save(&adaptor_expected,&adaptor_expected_ge);
      iVar1 = bcmp(&adaptor_expected,adaptor,0x40);
      if (iVar1 != 0) {
        secp256k1_scalar_negate(&sStack_1a8,&sStack_1a8);
      }
      secp256k1_scalar_get_b32(adaptor_secret32,&sStack_1a8);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_extract_secret(const secp256k1_context* ctx, unsigned char *adaptor_secret32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig65, const secp256k1_pubkey *adaptor) {
    secp256k1_scalar sp;
    secp256k1_scalar s, r;
    secp256k1_scalar adaptor_secret;
    secp256k1_ge adaptor_expected_ge;
    secp256k1_gej adaptor_expected_gej;
    secp256k1_pubkey adaptor_expected;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, NULL, &sp, adaptor_sig65)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_inverse(&adaptor_secret, &s);
    secp256k1_scalar_mul(&adaptor_secret, &adaptor_secret, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &adaptor_expected_gej, &adaptor_secret);
    secp256k1_ge_set_gej(&adaptor_expected_ge, &adaptor_expected_gej);
    secp256k1_pubkey_save(&adaptor_expected, &adaptor_expected_ge);
    if (memcmp(&adaptor_expected, adaptor, sizeof(adaptor_expected)) != 0) {
        secp256k1_scalar_negate(&adaptor_secret, &adaptor_secret);
    }
    secp256k1_scalar_get_b32(adaptor_secret32, &adaptor_secret);

    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}